

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knucleotide.cc
# Opt level: O1

int main(void)

{
  long lVar1;
  byte *pbVar2;
  char *pcVar3;
  Data data;
  array<char,_256UL> buf;
  undefined1 local_149;
  Data local_148;
  uint local_130;
  short local_12c;
  
  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (byte *)0x0;
  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (byte *)0x0;
  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    pcVar3 = fgets((char *)&local_130,0x100,_stdin);
    if (pcVar3 == (char *)0x0) break;
  } while (local_12c != 0x4545 || local_130 != 0x5248543e);
  pcVar3 = fgets((char *)&local_130,0x100,_stdin);
  lVar1 = std::cout;
  pbVar2 = local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar3 != (char *)0x0) {
    do {
      if ((local_130 & 0xff) != 0x3b) {
        lVar1 = std::cout;
        pbVar2 = local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
        if ((local_130 & 0xff) == 0x3e) break;
        local_149 = 10;
        pcVar3 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (&local_130,&stack0xffffffffffffffd0,&local_149);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<char*>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_148,
                   local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_130,pcVar3);
      }
      pcVar3 = fgets((char *)&local_130,0x100,_stdin);
      lVar1 = std::cout;
      pbVar2 = local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (pcVar3 != (char *)0x0);
  }
  for (; std::cout = lVar1,
      pbVar2 != local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    *pbVar2 = cfg.to_num[*pbVar2];
    lVar1 = std::cout;
  }
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 3;
  *(uint *)(fgets + *(long *)(lVar1 + -0x18)) = *(uint *)(fgets + *(long *)(lVar1 + -0x18)) | 4;
  WriteFrequencies<1u>(&local_148);
  WriteFrequencies<2u>(&local_148);
  WriteCount<3u>(&local_148,"GGT");
  WriteCount<4u>(&local_148,"GGTA");
  WriteCount<6u>(&local_148,"GGTATT");
  WriteCount<12u>(&local_148,"GGTATTTTAATT");
  WriteCount<18u>(&local_148,"GGTATTTTAATTTATAGT");
  if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{
    Cfg::Data data;
    std::array<char, 256> buf;

    while(fgets(buf.data(), static_cast<int>(buf.size()), stdin) && memcmp(">THREE", buf.data(), 6));
    while(fgets(buf.data(), static_cast<int>(buf.size()), stdin) && buf.front() != '>') {
        if(buf.front() != ';'){
            auto i = std::find(buf.begin(), buf.end(), '\n');
            data.insert(data.end(), buf.begin(), i);
        }
    }
    std::transform(data.begin(), data.end(), data.begin(), [](unsigned char c){
        return cfg.to_num[c];
    });
    std::cout << std::setprecision(3) << std::setiosflags(std::ios::fixed);

    WriteFrequencies<1>(data);
    WriteFrequencies<2>(data);
    // value at left is the length of the passed string.
    WriteCount<3>(data, "GGT");
    WriteCount<4>(data, "GGTA");
    WriteCount<6>(data, "GGTATT");
    WriteCount<12>(data, "GGTATTTTAATT");
    WriteCount<18>(data, "GGTATTTTAATTTATAGT");
}